

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O2

void __thiscall kws::Generator::ReadConfigurationFile(Generator *this,char *configFile)

{
  bool bVar1;
  uint uVar2;
  XMLReader reader;
  allocator local_329;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  XMLReader local_288;
  
  XMLReader::XMLReader(&local_288);
  bVar1 = XMLReader::Open(&local_288,configFile);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_2a8,"Project",&local_329);
    XMLReader::GetValue(&local_328,&local_288,&local_2a8);
    std::__cxx11::string::operator=((string *)&this->m_ProjectTitle,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::string((string *)&local_2c8,"ProjectLogo",&local_329);
    XMLReader::GetValue(&local_328,&local_288,&local_2c8);
    std::__cxx11::string::operator=((string *)&this->m_ProjectLogo,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::string((string *)&local_2e8,"KWStyleLogo",&local_329);
    XMLReader::GetValue(&local_328,&local_288,&local_2e8);
    std::__cxx11::string::operator=((string *)&this->m_KWStyleLogo,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::string((string *)&local_308,"ErrorThreshold",&local_329);
    XMLReader::GetValue(&local_328,&local_288,&local_308);
    uVar2 = atoi(local_328._M_dataplus._M_p);
    this->m_ErrorThreshold = uVar2;
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    XMLReader::Close(&local_288);
  }
  XMLReader::~XMLReader(&local_288);
  return;
}

Assistant:

void Generator::ReadConfigurationFile(const char* configFile)
{
  kws::XMLReader reader;
  if(reader.Open(configFile))
    {
    m_ProjectTitle = reader.GetValue("Project");
    m_ProjectLogo = reader.GetValue("ProjectLogo");
    m_KWStyleLogo = reader.GetValue("KWStyleLogo");
    m_ErrorThreshold = atoi(reader.GetValue("ErrorThreshold").c_str());
    reader.Close();
    }
}